

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O1

int32_t __thiscall
icu_63::UnicodeString::doIndexOf(UnicodeString *this,UChar32 c,int32_t start,int32_t length)

{
  short sVar1;
  UChar *pUVar2;
  int iVar3;
  int count;
  char16_t *pcVar4;
  int32_t iVar5;
  
  sVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar3 = (this->fUnion).fFields.fLength;
  }
  else {
    iVar3 = (int)sVar1 >> 5;
  }
  iVar5 = start;
  if (iVar3 < start) {
    iVar5 = iVar3;
  }
  if (start < 0) {
    iVar5 = 0;
  }
  count = iVar3 - iVar5;
  if (length <= iVar3 - iVar5) {
    count = length;
  }
  if (length < 0) {
    count = 0;
  }
  if (((int)sVar1 & 2U) == 0) {
    pcVar4 = (this->fUnion).fFields.fArray;
  }
  else {
    pcVar4 = (char16_t *)((long)&this->fUnion + 2);
  }
  pUVar2 = u_memchr32_63(pcVar4 + iVar5,c,count);
  return -(uint)(pUVar2 == (UChar *)0x0) | (uint)((ulong)((long)pUVar2 - (long)pcVar4) >> 1);
}

Assistant:

int32_t
UnicodeString::doIndexOf(UChar32 c,
                         int32_t start,
                         int32_t length) const {
  // pin indices
  pinIndices(start, length);

  // find the first occurrence of c
  const UChar *array = getArrayStart();
  const UChar *match = u_memchr32(array + start, c, length);
  if(match == NULL) {
    return -1;
  } else {
    return (int32_t)(match - array);
  }
}